

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O0

ServerSegment * __thiscall ServerService::parseRequest(ServerService *this,byte *buffer)

{
  byte ackFlag_00;
  byte finFlag_00;
  byte4 seqNumber;
  byte4 ackNumber;
  byte2 checksum_00;
  byte2 reserved_00;
  ServerSegment *this_00;
  byte *data;
  byte2 reserved;
  byte2 checksum;
  byte2 length;
  byte finFlag;
  byte ackFlag;
  byte4 ackNo;
  byte4 seqNo;
  byte *buffer_local;
  ServerService *this_local;
  
  seqNumber = *(byte4 *)buffer;
  ackNumber = *(byte4 *)(buffer + 4);
  ackFlag_00 = buffer[8];
  finFlag_00 = buffer[9];
  checksum_00 = *(byte2 *)(buffer + 0xc);
  reserved_00 = *(byte2 *)(buffer + 0xe);
  this_00 = (ServerSegment *)operator_new(0x18);
  ServerSegment::ServerSegment
            (this_00,seqNumber,finFlag_00,buffer + 0x10,ackNumber,ackFlag_00,checksum_00,reserved_00
            );
  return this_00;
}

Assistant:

ServerSegment *ServerService::parseRequest(byte *buffer) {
    byte4 seqNo = (buffer[3] << 24) | (buffer[2] << 16) | (buffer[1] << 8) | (buffer[0]);
    byte4 ackNo = (buffer[7] << 24) | (buffer[6] << 16) | (buffer[5] << 8) | (buffer[4]);
    byte ackFlag = (byte) buffer[8];
    byte finFlag = (byte) buffer[9];
    byte2 length = (buffer[11] << 8) | (buffer[10]);
    byte2 checksum = (buffer[13] << 8) | (buffer[12]);
    byte2 reserved = (buffer[15] << 8) | (buffer[14]);
    byte *data = &buffer[16];
    return new ServerSegment(seqNo, finFlag, data, ackNo, ackFlag, checksum, reserved);
}